

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::createInstance
          (ShaderOperatorCase *this,Context *context)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  ShaderRenderCaseInstance *this_00;
  long lVar4;
  float *pfVar5;
  int rowNdx;
  int row;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  BaseAttributeType type;
  ulong uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float local_d8 [2];
  long lStack_d0;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *local_c0;
  _func_int **local_b8;
  Context *pCStack_b0;
  undefined8 local_a8;
  SparseContext *pSStack_a0;
  undefined8 local_98;
  Allocator *pAStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Mat4 attribMatrix;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x250);
  local_b8 = *(_func_int ***)&this->m_spec;
  pCStack_b0 = *(Context **)&(this->m_spec).referenceScale;
  local_a8._0_4_ = (this->m_spec).precision;
  local_a8._4_4_ = (this->m_spec).output;
  pSStack_a0 = *(SparseContext **)&(this->m_spec).numInputs;
  local_98._0_4_ = (this->m_spec).inputs[0].rangeMin;
  local_98._4_4_ = (this->m_spec).inputs[0].rangeMax;
  pAStack_90 = *(Allocator **)((this->m_spec).inputs + 1);
  local_88 = *(undefined8 *)&(this->m_spec).inputs[1].rangeMax;
  uStack_80._0_4_ = (this->m_spec).inputs[2].rangeMin;
  uStack_80._4_4_ = (this->m_spec).inputs[2].rangeMax;
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (this_00,context,(this->super_ShaderRenderCase).m_isVertexCase,
             (this->super_ShaderRenderCase).m_evaluator.
             super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
             .m_data.ptr,
             (this->super_ShaderRenderCase).m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,(AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,0);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d5baf0;
  this_00[1].m_imageBackingMode = (undefined4)local_a8;
  this_00[1].m_quadGridSize = local_a8._4_4_;
  this_00[1].m_sparseContext.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
  .m_data.ptr = pSStack_a0;
  this_00[1].super_TestInstance._vptr_TestInstance = local_b8;
  this_00[1].super_TestInstance.m_context = pCStack_b0;
  *(undefined8 *)
   &this_00[1].m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.field_0x8 = local_98;
  this_00[1].m_memAlloc = pAStack_90;
  *(undefined8 *)this_00[1].m_clearColor.m_data = local_88;
  *(undefined8 *)(this_00[1].m_clearColor.m_data + 2) = uStack_80;
  local_c0 = &this_00->m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (local_c0,(long)*(int *)&this_00[1].m_sparseContext.
                                     super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                                     .m_data.ptr);
  if (0 < *(int *)&this_00[1].m_sparseContext.
                   super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                   .m_data.ptr) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      fVar1 = *(float *)((long)(&this_00[1].m_clearColor + -1) + uVar10 * 0xc);
      fVar2 = this_00[1].m_clearColor.m_data[uVar10 * 3 + -3];
      attribMatrix.m_data.m_data[3].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[3] = 0.0;
      lVar4 = 0;
      lVar7 = 0;
      pfVar5 = (float *)&attribMatrix;
      do {
        lVar8 = 0;
        do {
          uVar11 = 0x3f800000;
          if (lVar4 != lVar8) {
            uVar11 = 0;
          }
          *(undefined4 *)((long)pfVar5 + lVar8) = uVar11;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x40);
        lVar7 = lVar7 + 1;
        pfVar5 = pfVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (lVar7 != 4);
      fVar12 = fVar2 - fVar1;
      lVar4 = 0;
      pfVar5 = (float *)&attribMatrix;
      do {
        type = (BaseAttributeType)uVar10;
        uVar6 = (int)lVar4 + type;
        uVar3 = (int)lVar4 + 3 + type;
        if (-1 < (int)uVar6) {
          uVar3 = uVar6;
        }
        local_d8[0] = 0.0;
        local_d8[1] = 0.0;
        lStack_d0 = 0;
        fVar13 = fVar1;
        switch(uVar6 - (uVar3 & 0xfffffffc)) {
        case 0:
          local_d8[1] = 0.0;
          local_d8[0] = fVar12;
          break;
        case 1:
          local_d8[1] = fVar12;
          local_d8[0] = 0.0;
          break;
        case 2:
          local_d8[1] = 0.0;
          fVar13 = fVar2;
          local_d8[0] = -fVar12;
          break;
        case 3:
          local_d8[1] = -fVar12;
          fVar13 = fVar2;
          local_d8[0] = 0.0;
          break;
        default:
          goto switchD_0060dde0_default;
        }
        lStack_d0 = (ulong)(uint)fVar13 << 0x20;
switchD_0060dde0_default:
        lVar7 = 0;
        do {
          pfVar5[lVar7] = *(float *)((long)local_d8 + lVar7);
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x10);
        lVar4 = lVar4 + 1;
        pfVar5 = pfVar5 + 1;
      } while (lVar4 != 4);
      lVar4 = (long)(((local_c0->
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data + lVar9;
      lVar7 = 0;
      pfVar5 = (float *)&attribMatrix;
      do {
        lVar8 = 0;
        do {
          *(undefined4 *)(lVar4 + lVar8) = *(undefined4 *)((long)pfVar5 + lVar8);
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x40);
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + 4;
        pfVar5 = pfVar5 + 1;
      } while (lVar7 != 4);
      if (uVar10 < 4) {
        ShaderRenderCaseInstance::useAttribute(this_00,type | MAT2,type);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x40;
    } while ((long)uVar10 <
             (long)*(int *)&this_00[1].m_sparseContext.
                            super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                            .m_data.ptr);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* ShaderOperatorCase::createInstance (Context& context) const
{
	DE_ASSERT(m_evaluator != DE_NULL);
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new ShaderOperatorCaseInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_spec);
}